

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdGetIssuanceBlindingKey
              (void *handle,char *master_blinding_key,char *txid,uint32_t vout,char **blinding_key)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  allocator local_cb;
  allocator local_ca;
  ElementsTransactionApi api;
  Privkey privkey;
  string local_a8;
  string local_88;
  Txid local_68;
  string local_48;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(master_blinding_key);
  if (bVar1) {
    privkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_elements_transaction.cpp";
    privkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x41d;
    privkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdGetIssuanceBlindingKey";
    cfd::core::logger::warn<>((CfdSourceLocation *)&privkey,"master blinding key is null or empty.")
    ;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&privkey,"Failed to parameter. master blinding key is null or empty.",
               (allocator *)&local_a8);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&privkey);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (!bVar1) {
    if (blinding_key != (char **)0x0) {
      std::__cxx11::string::string((string *)&local_48,master_blinding_key,&local_ca);
      cfd::core::Privkey::Privkey((Privkey *)&local_a8,&local_48,kMainnet,true);
      std::__cxx11::string::string((string *)&local_88,txid,&local_cb);
      cfd::core::Txid::Txid(&local_68,&local_88);
      cfd::api::ElementsTransactionApi::GetIssuanceBlindingKey
                ((Privkey_conflict *)&privkey,&api,(Privkey_conflict *)&local_a8,&local_68,vout);
      cfd::core::Txid::~Txid(&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
      std::__cxx11::string::~string((string *)&local_48);
      cfd::core::Privkey::GetHex_abi_cxx11_(&local_a8,&privkey);
      pcVar2 = cfd::capi::CreateString(&local_a8);
      *blinding_key = pcVar2;
      std::__cxx11::string::~string((string *)&local_a8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey);
      return 0;
    }
    privkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_elements_transaction.cpp";
    privkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x429;
    privkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdGetIssuanceBlindingKey";
    cfd::core::logger::warn<>((CfdSourceLocation *)&privkey,"blinding key is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&privkey,"Failed to parameter. blinding key is null.",
               (allocator *)&local_a8);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&privkey);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  privkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_elements_transaction.cpp";
  privkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x423;
  privkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdGetIssuanceBlindingKey";
  cfd::core::logger::warn<>((CfdSourceLocation *)&privkey,"txid is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&privkey,"Failed to parameter. txid is null or empty.",(allocator *)&local_a8
            );
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&privkey);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetIssuanceBlindingKey(
    void* handle, const char* master_blinding_key, const char* txid,
    uint32_t vout, char** blinding_key) {
  try {
    cfd::Initialize();
    if (IsEmptyString(master_blinding_key)) {
      warn(CFD_LOG_SOURCE, "master blinding key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. master blinding key is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (blinding_key == nullptr) {
      warn(CFD_LOG_SOURCE, "blinding key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. blinding key is null.");
    }

    ElementsTransactionApi api;
    Privkey privkey = api.GetIssuanceBlindingKey(
        Privkey(std::string(master_blinding_key)), Txid(txid),
        static_cast<int32_t>(vout));

    *blinding_key = CreateString(privkey.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}